

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.h
# Opt level: O3

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  OwnPromiseNode node;
  undefined4 in_register_00000034;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_21;
  OwnPromiseNode local_20;
  code *local_18;
  
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,__fd))(&local_20);
  local_18 = kj::_::
             SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:260:68)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::Promise<unsigned_long>::ignoreResult()::_lambda(unsigned_long&&)_1_>,kj::_::PromiseDisposer,kj::Promise<unsigned_long>::ignoreResult()::_lambda(unsigned_long&&)_1_,void*&>
            ((PromiseDisposer *)this,&local_20,&local_21,&local_18);
  node.ptr = local_20.ptr;
  if (&(local_20.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_20.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> read(ArrayPtr<byte> buffer) {
    return read(buffer, buffer.size()).ignoreResult();
  }